

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  int iVar2;
  int iVar3;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  
  pIVar1 = in_RDI->Data;
  iVar3 = in_RDI->Size + -1;
  if ((pIVar1[iVar3].ElemCount == 0) || ((ImDrawCmd *)pIVar1[iVar3].TextureId == in_RDI[9].Data)) {
    if ((pIVar1[iVar3].ElemCount == 0) &&
       (((1 < in_RDI->Size &&
         (iVar2 = memcmp(&in_RDI[8].Data,pIVar1 + (long)iVar3 + -1,0x1c), iVar2 == 0)) &&
        (pIVar1[(long)iVar3 + -1].UserCallback == (ImDrawCallback)0x0)))) {
      ImVector<ImDrawCmd>::pop_back(in_RDI);
      return;
    }
    pIVar1[iVar3].TextureId = in_RDI[9].Data;
  }
  else {
    AddDrawCmd((ImDrawList *)prev_cmd);
  }
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}